

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall
TDeletingArray<FOptionMenuItem_*,_FOptionMenuItem_*>::~TDeletingArray
          (TDeletingArray<FOptionMenuItem_*,_FOptionMenuItem_*> *this)

{
  FOptionMenuItem *pFVar1;
  ulong uVar2;
  
  if ((this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>).Count != 0) {
    uVar2 = 0;
    do {
      pFVar1 = (this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>).Array[uVar2];
      if (pFVar1 != (FOptionMenuItem *)0x0) {
        (*(pFVar1->super_FListMenuItem)._vptr_FListMenuItem[1])();
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < (this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>).Count);
  }
  TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::~TArray
            (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>);
  return;
}

Assistant:

~TDeletingArray<T, TT> ()
	{
		for (unsigned int i = 0; i < TArray<T,TT>::Size(); ++i)
		{
			if ((*this)[i] != NULL) 
				delete (*this)[i];
		}
	}